

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O0

void __thiscall cmStateSnapshot::SetDirectoryDefinitions(cmStateSnapshot *this)

{
  string *psVar1;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  cmStateSnapshot *local_10;
  cmStateSnapshot *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"CMAKE_SOURCE_DIR",&local_31);
  psVar1 = cmState::GetSourceDirectory_abi_cxx11_(this->State);
  SetDefinition(this,&local_30,psVar1);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"CMAKE_CURRENT_SOURCE_DIR",&local_69);
  psVar1 = cmState::GetSourceDirectory_abi_cxx11_(this->State);
  SetDefinition(this,&local_68,psVar1);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"CMAKE_BINARY_DIR",&local_91);
  psVar1 = cmState::GetBinaryDirectory_abi_cxx11_(this->State);
  SetDefinition(this,&local_90,psVar1);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"CMAKE_CURRENT_BINARY_DIR",&local_b9);
  psVar1 = cmState::GetBinaryDirectory_abi_cxx11_(this->State);
  SetDefinition(this,&local_b8,psVar1);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  return;
}

Assistant:

void cmStateSnapshot::SetDirectoryDefinitions()
{
  this->SetDefinition("CMAKE_SOURCE_DIR", this->State->GetSourceDirectory());
  this->SetDefinition("CMAKE_CURRENT_SOURCE_DIR",
                      this->State->GetSourceDirectory());
  this->SetDefinition("CMAKE_BINARY_DIR", this->State->GetBinaryDirectory());
  this->SetDefinition("CMAKE_CURRENT_BINARY_DIR",
                      this->State->GetBinaryDirectory());
}